

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_relaxation.c
# Opt level: O1

int ARKodeSetRelaxLowerBound(void *arkode_mem,sunrealtype lower)

{
  int iVar1;
  ARKodeRelaxMem relax_mem;
  ARKodeMem ark_mem;
  ARKodeRelaxMem local_18;
  ARKodeMem local_10;
  
  iVar1 = arkRelaxAccessMem(arkode_mem,"ARKodeSetRelaxLowerBound",&local_10,&local_18);
  if (iVar1 == 0) {
    if (local_10->step_supports_relaxation == 0) {
      iVar1 = -0x30;
      arkProcessError(local_10,-0x30,0x1dd,"ARKodeSetRelaxLowerBound",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_relaxation.c"
                      ,"time-stepping module does not support relaxation");
    }
    else {
      if ((lower <= 0.0) || (1.0 <= lower)) {
        local_18->lower_bound = 0.8;
      }
      else {
        local_18->lower_bound = lower;
      }
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int ARKodeSetRelaxLowerBound(void* arkode_mem, sunrealtype lower)
{
  int retval;
  ARKodeMem ark_mem;
  ARKodeRelaxMem relax_mem;

  retval = arkRelaxAccessMem(arkode_mem, __func__, &ark_mem, &relax_mem);
  if (retval) { return retval; }

  /* Guard against use for time steppers that do not allow relaxation */
  if (!ark_mem->step_supports_relaxation)
  {
    arkProcessError(ark_mem, ARK_STEPPER_UNSUPPORTED, __LINE__, __func__,
                    __FILE__, "time-stepping module does not support relaxation");
    return (ARK_STEPPER_UNSUPPORTED);
  }

  if (lower > ZERO && lower < ONE) { relax_mem->lower_bound = lower; }
  else { relax_mem->lower_bound = ARK_RELAX_DEFAULT_LOWER_BOUND; }

  return ARK_SUCCESS;
}